

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O1

bool duckdb::SkipToClose(StringCastInputState *input_state)

{
  ulong *puVar1;
  ulong *puVar2;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  byte bVar6;
  byte unaff_R15B;
  bool bVar7;
  vector<char,_true> brackets;
  char local_49;
  vector<char,_std::allocator<char>_> local_48;
  
  puVar1 = input_state->pos;
  puVar2 = input_state->len;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (char *)0x0;
  do {
    if (*puVar2 <= *puVar1) {
      bVar6 = 0;
      break;
    }
    bVar6 = input_state->buf[*puVar1];
    if (bVar6 < 0x28) {
      if ((bVar6 == 0x22) || (bVar6 == 0x27)) {
        if (input_state->escaped != false) goto LAB_007ff50a;
        bVar4 = SkipToCloseQuotes(input_state);
        bVar6 = 0;
        bVar7 = false;
        bVar3 = false;
        if (!bVar4) goto LAB_007ff519;
        goto LAB_007ff50c;
      }
LAB_007ff526:
      pbVar5 = (byte *)vector<char,_true>::back((vector<char,_true> *)&local_48);
      if (bVar6 != *pbVar5) {
        bVar7 = input_state->buf[*puVar1] == '\\';
        goto LAB_007ff50c;
      }
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      bVar7 = false;
      if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) goto LAB_007ff50c;
      bVar6 = 1;
      bVar3 = false;
    }
    else {
      if (bVar6 == 0x28) {
        local_49 = ')';
        if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          ::std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                    (&local_48,
                     (iterator)
                     local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_49);
        }
        else {
          *local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish = ')';
LAB_007ff505:
          local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      else if (bVar6 == 0x5b) {
        local_49 = ']';
        if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish !=
            local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          *local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish = ']';
          goto LAB_007ff505;
        }
        ::std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  (&local_48,
                   (iterator)
                   local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_49);
      }
      else {
        if (bVar6 != 0x7b) goto LAB_007ff526;
        local_49 = '}';
        if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish !=
            local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          *local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish = '}';
          goto LAB_007ff505;
        }
        ::std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  (&local_48,
                   (iterator)
                   local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_49);
      }
LAB_007ff50a:
      bVar7 = false;
LAB_007ff50c:
      input_state->escaped = bVar7;
      *puVar1 = *puVar1 + 1;
      bVar3 = true;
      bVar6 = unaff_R15B;
    }
LAB_007ff519:
    unaff_R15B = bVar6;
  } while (bVar3);
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (bool)(bVar6 & 1);
}

Assistant:

static bool SkipToClose(StringCastInputState &input_state) {
	auto &idx = input_state.pos;
	auto &buf = input_state.buf;
	auto &len = input_state.len;

	D_ASSERT(buf[idx] == '{' || buf[idx] == '[' || buf[idx] == '(');

	vector<char> brackets;
	while (idx < len) {
		bool set_escaped = false;
		if (buf[idx] == '"' || buf[idx] == '\'') {
			if (!input_state.escaped) {
				if (!SkipToCloseQuotes(input_state)) {
					return false;
				}
			}
		} else if (buf[idx] == '{') {
			brackets.push_back('}');
		} else if (buf[idx] == '(') {
			brackets.push_back(')');
		} else if (buf[idx] == '[') {
			brackets.push_back(']');
		} else if (buf[idx] == brackets.back()) {
			brackets.pop_back();
			if (brackets.empty()) {
				return true;
			}
		} else if (buf[idx] == '\\') {
			//! Note that we don't treat `\\` special here, backslashes can't be escaped outside of quotes
			//! backslashes within quotes will not be encountered in this function
			set_escaped = true;
		}
		input_state.escaped = set_escaped;
		idx++;
	}
	return false;
}